

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall QTextCursor::mergeCharFormat(QTextCursor *this,QTextCharFormat *modifier)

{
  QTextCursorPrivate *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      pQVar1 = (this->d).d.ptr;
      iVar2 = pQVar1->position;
      if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      pQVar1 = (this->d).d.ptr;
      if (iVar2 != pQVar1->anchor) {
        if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
           ((__atomic_base<int>)
            *(__int_type *)
             &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
          QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QTextCursorPrivate::setCharFormat((this->d).d.ptr,modifier,MergeFormat);
          return;
        }
        goto LAB_004c736b;
      }
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      charFormat((QTextCursor *)local_38);
      QTextFormat::merge((QTextFormat *)local_38,&modifier->super_QTextFormat);
      pQVar1 = (this->d).d.ptr;
      if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      iVar2 = QTextFormatCollection::indexForFormat
                        (&((this->d).d.ptr)->priv->formats,(QTextFormat *)local_38);
      pQVar1 = (this->d).d.ptr;
      if ((pQVar1 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      ((this->d).d.ptr)->currentCharFormat = iVar2;
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_004c736b:
  __stack_chk_fail();
}

Assistant:

void QTextCursor::mergeCharFormat(const QTextCharFormat &modifier)
{
    if (!d || !d->priv)
        return;
    if (d->position == d->anchor) {
        QTextCharFormat format = charFormat();
        format.merge(modifier);
        d->currentCharFormat = d->priv->formatCollection()->indexForFormat(format);
        return;
    }

    d->setCharFormat(modifier, QTextDocumentPrivate::MergeFormat);
}